

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif.cpp
# Opt level: O2

void __thiscall Potassco::AspifOutput::external(AspifOutput *this,Atom_t a,Value_t v)

{
  startDir(this,(Directive_t)0x5);
  add(this,a);
  add(this,v.val_);
  endDir(this);
  return;
}

Assistant:

void AspifOutput::external(Atom_t a, Value_t v) {
	startDir(Directive_t::External).add(static_cast<int>(a)).add(static_cast<int>(v)).endDir();
}